

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

BrotliEncoderState *
BrotliEncoderCreateInstance(brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  BrotliEncoderState *local_30;
  BrotliEncoderState *state;
  void *opaque_local;
  brotli_free_func free_func_local;
  brotli_alloc_func alloc_func_local;
  
  local_30 = (BrotliEncoderState *)0x0;
  if ((alloc_func == (brotli_alloc_func)0x0) && (free_func == (brotli_free_func)0x0)) {
    local_30 = (BrotliEncoderState *)malloc(0x19d8);
  }
  else if ((alloc_func != (brotli_alloc_func)0x0) && (free_func != (brotli_free_func)0x0)) {
    local_30 = (BrotliEncoderState *)(*alloc_func)(opaque,0x19d8);
  }
  if (local_30 == (BrotliEncoderState *)0x0) {
    alloc_func_local = (brotli_alloc_func)0x0;
  }
  else {
    BrotliInitMemoryManager(&local_30->memory_manager_,alloc_func,free_func,opaque);
    BrotliEncoderInitState(local_30);
    local_30->back_refs_position_ = 0;
    local_30->current_block_literals_ = 0;
    local_30->current_block_cmds_ = 0;
    alloc_func_local = (brotli_alloc_func)local_30;
  }
  return (BrotliEncoderState *)alloc_func_local;
}

Assistant:

BrotliEncoderState* BrotliEncoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliEncoderState* state = 0;
  if (!alloc_func && !free_func) {
    state = (BrotliEncoderState*)malloc(sizeof(BrotliEncoderState));
  } else if (alloc_func && free_func) {
    state = (BrotliEncoderState*)alloc_func(opaque, sizeof(BrotliEncoderState));
  }
  if (state == 0) {
    /* BROTLI_DUMP(); */
    return 0;
  }
  BrotliInitMemoryManager(
      &state->memory_manager_, alloc_func, free_func, opaque);
  BrotliEncoderInitState(state);
  state->back_refs_position_ = 0;
  state->current_block_literals_ = 0;
  state->current_block_cmds_ = 0;
  return state;
}